

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O3

longdouble *
S2::GetProjection<long_double>
          (longdouble *__return_storage_ptr__,Vector3<long_double> *x,Vector3<long_double> *a_norm,
          longdouble a_norm_len,Vector3<long_double> *a0,Vector3<long_double> *a1,longdouble *error)

{
  longdouble *plVar1;
  longdouble *plVar2;
  bool bVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble local_c0;
  longdouble local_78;
  undefined4 local_6e;
  undefined2 local_6a;
  longdouble local_68;
  undefined4 local_5e;
  undefined2 local_5a;
  longdouble local_58;
  undefined4 local_4e;
  ushort local_4a;
  longdouble local_48;
  undefined4 local_3e;
  undefined2 local_3a;
  undefined1 auStack_38 [8];
  Vector3<long_double> x1;
  
  local_3a = *(undefined2 *)((long)__return_storage_ptr__ + 0xe);
  local_3e = *(undefined4 *)((long)__return_storage_ptr__ + 10);
  x1.c_[0]._6_2_ = *(undefined2 *)((long)__return_storage_ptr__ + 0x1e);
  x1.c_[0]._2_4_ = *(undefined4 *)((long)__return_storage_ptr__ + 0x1a);
  x1.c_[1]._6_2_ = *(undefined2 *)((long)__return_storage_ptr__ + 0x2e);
  x1.c_[1]._2_4_ = *(undefined4 *)((long)__return_storage_ptr__ + 0x2a);
  local_48 = *__return_storage_ptr__ - *(longdouble *)a_norm->c_;
  _auStack_38 = __return_storage_ptr__[1] - *(longdouble *)(a_norm->c_ + 1);
  x1.c_._8_10_ = __return_storage_ptr__[2] - *(longdouble *)(a_norm->c_ + 2);
  local_6a = *(undefined2 *)((long)__return_storage_ptr__ + 0xe);
  local_6e = *(undefined4 *)((long)__return_storage_ptr__ + 10);
  local_5a = *(undefined2 *)((long)__return_storage_ptr__ + 0x1e);
  local_5e = *(undefined4 *)((long)__return_storage_ptr__ + 0x1a);
  local_4e = *(undefined4 *)((long)__return_storage_ptr__ + 0x2a);
  plVar2 = (longdouble *)(ulong)*(ushort *)((long)__return_storage_ptr__ + 0x2e);
  local_4a = *(ushort *)((long)__return_storage_ptr__ + 0x2e);
  local_78 = *__return_storage_ptr__ - *(longdouble *)a0->c_;
  local_68 = __return_storage_ptr__[1] - *(longdouble *)(a0->c_ + 1);
  local_58 = __return_storage_ptr__[2] - *(longdouble *)(a0->c_ + 2);
  lVar5 = (longdouble)x1.c_._8_10_ * (longdouble)x1.c_._8_10_ +
          _auStack_38 * _auStack_38 + local_48 * local_48;
  lVar6 = local_58 * local_58 + local_68 * local_68 + local_78 * local_78;
  x1.c_[2]._4_10_ = a_norm_len;
  lVar4 = _auStack_38;
  lVar7 = local_48;
  lVar8 = lVar5;
  local_c0 = (longdouble)x1.c_._8_10_;
  if (lVar6 <= lVar5) {
    lVar4 = local_68;
    lVar7 = local_78;
    lVar8 = lVar6;
    local_c0 = local_58;
    if ((lVar5 == lVar6) && (!NAN(lVar5) && !NAN(lVar6))) {
      plVar2 = (longdouble *)0x0;
      do {
        lVar4 = _auStack_38;
        lVar7 = local_48;
        lVar8 = lVar5;
        local_c0 = (longdouble)x1.c_._8_10_;
        if ((*(longdouble *)((long)&local_48 + (long)plVar2) <
             *(longdouble *)((long)&local_78 + (long)plVar2)) ||
           (lVar4 = local_68, lVar7 = local_78, lVar8 = lVar6, local_c0 = local_58,
           *(longdouble *)((long)&local_78 + (long)plVar2) <
           *(longdouble *)((long)&local_48 + (long)plVar2))) break;
        plVar1 = plVar2 + 1;
        bVar3 = plVar2 != (longdouble *)0x20;
        plVar2 = plVar1;
      } while (bVar3);
    }
  }
  *(longdouble *)a1->c_ =
       (ABS(local_c0 * *(longdouble *)(x->c_ + 2) +
            (longdouble)0 + *(longdouble *)x->c_ * lVar7 + *(longdouble *)(x->c_ + 1) * lVar4) *
        (longdouble)1.5 +
       (a_norm_len * (longdouble)6.964101615137754 + (longdouble)6.153480596427404e-15) *
       SQRT(lVar8)) * (longdouble)5.421011e-20;
  return plVar2;
}

Assistant:

static T GetProjection(const Vector3<T>& x,
                       const Vector3<T>& a_norm, T a_norm_len,
                       const Vector3<T>& a0, const Vector3<T>& a1,
                       T* error) {
  // The error in the dot product is proportional to the lengths of the input
  // vectors, so rather than using "x" itself (a unit-length vector) we use
  // the vectors from "x" to the closer of the two edge endpoints.  This
  // typically reduces the error by a huge factor.
  Vector3<T> x0 = x - a0;
  Vector3<T> x1 = x - a1;
  T x0_dist2 = x0.Norm2();
  T x1_dist2 = x1.Norm2();

  // If both distances are the same, we need to be careful to choose one
  // endpoint deterministically so that the result does not change if the
  // order of the endpoints is reversed.
  T dist, result;
  if (x0_dist2 < x1_dist2 || (x0_dist2 == x1_dist2 && x0 < x1)) {
    dist = sqrt(x0_dist2);
    result = x0.DotProd(a_norm);
  } else {
    dist = sqrt(x1_dist2);
    result = x1.DotProd(a_norm);
  }
  // This calculation bounds the error from all sources: the computation of
  // the normal, the subtraction of one endpoint, and the dot product itself.
  // (DBL_ERR appears because the input points are assumed to be normalized in
  // double precision rather than in the given type T.)
  //
  // For reference, the bounds that went into this calculation are:
  // ||N'-N|| <= ((1 + 2 * sqrt(3))||N|| + 32 * sqrt(3) * DBL_ERR) * T_ERR
  // |(A.B)'-(A.B)| <= (1.5 * (A.B) + 1.5 * ||A|| * ||B||) * T_ERR
  // ||(X-Y)'-(X-Y)|| <= ||X-Y|| * T_ERR
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  *error = (((3.5 + 2 * sqrt(3)) * a_norm_len + 32 * sqrt(3) * DBL_ERR)
            * dist + 1.5 * fabs(result)) * T_ERR;
  return result;
}